

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O3

void __thiscall xercesc_4_0::SGXMLScanner::scanReset(SGXMLScanner *this,InputSource *src)

{
  ReaderMgr *this_00;
  XMLValidator *pXVar1;
  XMLErrorReporter *pXVar2;
  XMLDocumentHandler *pXVar3;
  XMLEntityHandler *pXVar4;
  ValidationContext *pVVar5;
  MemoryManager *pMVar6;
  XMLStringPool *pXVar7;
  SchemaValidator *pSVar8;
  SecurityManager *pSVar9;
  uint uVar10;
  int iVar11;
  XSModel *pXVar12;
  SchemaGrammar *this_01;
  PSVIElement *this_02;
  ValueStackOf<bool> *pVVar13;
  undefined4 extraout_var;
  XMLReader *reader;
  XMLSize_t XVar14;
  RuntimeException *this_03;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  GrammarResolver::cacheGrammarFromParse
            ((this->super_XMLScanner).fGrammarResolver,(this->super_XMLScanner).fToCacheGrammar);
  ((this->super_XMLScanner).fGrammarResolver)->fUseCachedGrammar =
       (this->super_XMLScanner).fUseCachedGrammar;
  RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::removeAll
            (this->fSchemaInfoList);
  if ((this->fModel != (XSModel *)0x0) &&
     ((this->super_XMLScanner).fPSVIHandler != (PSVIHandler *)0x0)) {
    pXVar12 = GrammarResolver::getXSModel((this->super_XMLScanner).fGrammarResolver);
    this->fModel = pXVar12;
  }
  this_01 = this->fSchemaGrammar;
  if (this_01 == (SchemaGrammar *)0x0) {
    this_01 = (SchemaGrammar *)
              XMemory::operator_new(0x98,(this->super_XMLScanner).fGrammarPoolMemoryManager);
    SchemaGrammar::SchemaGrammar(this_01,(this->super_XMLScanner).fGrammarPoolMemoryManager);
    this->fSchemaGrammar = this_01;
  }
  (this->super_XMLScanner).fGrammar = &this_01->super_Grammar;
  this->fGrammarType = DTDGrammarType;
  (this->super_XMLScanner).fRootGrammar = (Grammar *)0x0;
  pXVar1 = (this->super_XMLScanner).fValidator;
  (*pXVar1->_vptr_XMLValidator[0xb])(pXVar1,this_01);
  if ((this->super_XMLScanner).fValidatorFromUser == true) {
    pXVar2 = (this->super_XMLScanner).fErrorReporter;
    pXVar1 = (this->super_XMLScanner).fValidator;
    pXVar1->fErrorReporter = pXVar2;
    pXVar1[4].fErrorReporter = pXVar2;
    pXVar1[1].fErrorReporter = (XMLErrorReporter *)(this->super_XMLScanner).fGrammarResolver;
    *(bool *)&pXVar1[4].fBufMgr = (this->super_XMLScanner).fExitOnFirstFatal;
  }
  (this->super_XMLScanner).fValidate = (this->super_XMLScanner).fValScheme == Val_Always;
  pXVar3 = (this->super_XMLScanner).fDocHandler;
  if (pXVar3 != (XMLDocumentHandler *)0x0) {
    (*pXVar3->_vptr_XMLDocumentHandler[9])();
  }
  pXVar4 = (this->super_XMLScanner).fEntityHandler;
  if (pXVar4 != (XMLEntityHandler *)0x0) {
    (*pXVar4->_vptr_XMLEntityHandler[4])();
  }
  pXVar2 = (this->super_XMLScanner).fErrorReporter;
  if (pXVar2 != (XMLErrorReporter *)0x0) {
    (*pXVar2->_vptr_XMLErrorReporter[3])();
  }
  (*((this->super_XMLScanner).fValidationContext)->_vptr_ValidationContext[4])();
  pVVar5 = (this->super_XMLScanner).fValidationContext;
  (*pVVar5->_vptr_ValidationContext[9])(pVVar5,0);
  (this->super_XMLScanner).fEntityDeclPoolRetrieved = false;
  pMVar6 = (this->super_XMLScanner).fMemoryManager;
  (*pMVar6->_vptr_MemoryManager[4])(pMVar6,(this->super_XMLScanner).fRootElemName);
  (this->super_XMLScanner).fRootElemName = (XMLCh *)0x0;
  if (this->fICHandler != (IdentityConstraintHandler *)0x0) {
    IdentityConstraintHandler::reset(this->fICHandler);
  }
  ElemStack::reset(&(this->super_XMLScanner).fElemStack,(this->super_XMLScanner).fEmptyNamespaceId,
                   (this->super_XMLScanner).fUnknownNamespaceId,
                   (this->super_XMLScanner).fXMLNamespaceId,
                   (this->super_XMLScanner).fXMLNSNamespaceId);
  if ((this->super_XMLScanner).fSchemaNamespaceId == 0) {
    pXVar7 = (this->super_XMLScanner).fURIStringPool;
    uVar10 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[5])
                       (pXVar7,&SchemaSymbols::fgURI_XSI);
    (this->super_XMLScanner).fSchemaNamespaceId = uVar10;
  }
  (this->super_XMLScanner).fInException = false;
  (this->super_XMLScanner).fStandalone = false;
  (this->super_XMLScanner).fErrorCount = 0;
  (this->super_XMLScanner).fHasNoDTD = true;
  this->fSeeXsi = false;
  (this->super_XMLScanner).fDoNamespaces = true;
  (this->super_XMLScanner).fDoSchema = true;
  if (this->fPSVIElement == (PSVIElement *)0x0) {
    this_02 = (PSVIElement *)XMemory::operator_new(0x68,(this->super_XMLScanner).fMemoryManager);
    PSVIElement::PSVIElement(this_02,(this->super_XMLScanner).fMemoryManager);
    this->fPSVIElement = this_02;
  }
  if (this->fErrorStack == (ValueStackOf<bool> *)0x0) {
    pVVar13 = (ValueStackOf<bool> *)
              XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
    pMVar6 = (this->super_XMLScanner).fMemoryManager;
    (pVVar13->fVector).fCallDestructor = false;
    (pVVar13->fVector).fCurCount = 0;
    (pVVar13->fVector).fMaxCount = 8;
    (pVVar13->fVector).fElemList = (bool *)0x0;
    (pVVar13->fVector).fMemoryManager = pMVar6;
    iVar11 = (*pMVar6->_vptr_MemoryManager[3])();
    (pVVar13->fVector).fElemList = (bool *)CONCAT44(extraout_var,iVar11);
    memset((bool *)CONCAT44(extraout_var,iVar11),0,(pVVar13->fVector).fMaxCount);
    this->fErrorStack = pVVar13;
  }
  else {
    (this->fErrorStack->fVector).fCurCount = 0;
  }
  (this->fPSVIElemContext).fIsSpecified = false;
  (this->fPSVIElemContext).fErrorOccurred = false;
  (this->fPSVIElemContext).fElemDepth = -1;
  (this->fPSVIElemContext).fFullValidationDepth = -1;
  (this->fPSVIElemContext).fNoneValidationDepth = -1;
  (this->fPSVIElemContext).fCurrentDV = (DatatypeValidator *)0x0;
  (this->fPSVIElemContext).fCurrentTypeInfo = (ComplexTypeInfo *)0x0;
  (this->fPSVIElemContext).fNormalizedValue = (XMLCh *)0x0;
  (*(this->fSchemaValidator->super_XMLValidator)._vptr_XMLValidator[6])();
  pSVar8 = this->fSchemaValidator;
  pXVar2 = (this->super_XMLScanner).fErrorReporter;
  (pSVar8->super_XMLValidator).fErrorReporter = pXVar2;
  (pSVar8->fSchemaErrorReporter).fErrorReporter = pXVar2;
  (pSVar8->fSchemaErrorReporter).fExitOnFirstFatal = (this->super_XMLScanner).fExitOnFirstFatal;
  pSVar8->fGrammarResolver = (this->super_XMLScanner).fGrammarResolver;
  if ((this->super_XMLScanner).fValidatorFromUser == true) {
    (*((this->super_XMLScanner).fValidator)->_vptr_XMLValidator[6])();
  }
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  reader = ReaderMgr::createReader
                     (this_00,src,true,RefFrom_NonLiteral,Type_General,Source_External,
                      (this->super_XMLScanner).fCalculateSrcOfs,
                      (this->super_XMLScanner).fLowWaterMark);
  if (reader != (XMLReader *)0x0) {
    ReaderMgr::pushReader(this_00,reader,(XMLEntityDecl *)0x0);
    pSVar9 = (this->super_XMLScanner).fSecurityManager;
    if (pSVar9 != (SecurityManager *)0x0) {
      XVar14 = (**(code **)(*(long *)pSVar9 + 0x18))();
      (this->super_XMLScanner).fEntityExpansionLimit = XVar14;
      (this->super_XMLScanner).fEntityExpansionCount = 0;
    }
    this->fElemCount = 0;
    if ((this->super_XMLScanner).fUIntPoolRowTotal < 0x20) {
      XMLScanner::resetUIntPool(&this->super_XMLScanner);
    }
    else {
      RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::removeAll(this->fAttDefRegistry);
      XMLScanner::recreateUIntPool(&this->super_XMLScanner);
    }
    Hash2KeysSetOf<xercesc_4_0::StringHasher>::removeAll(this->fUndeclaredAttrRegistry);
    return;
  }
  iVar11 = (*src->_vptr_InputSource[6])(src);
  this_03 = (RuntimeException *)__cxa_allocate_exception(0x30);
  if ((char)iVar11 == '\0') {
    iVar11 = (*src->_vptr_InputSource[5])(src);
    RuntimeException::RuntimeException
              (this_03,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/SGXMLScanner.cpp"
               ,0xc68,Scan_CouldNotOpenSource_Warning,(XMLCh *)CONCAT44(extraout_var_01,iVar11),
               (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
  }
  else {
    iVar11 = (*src->_vptr_InputSource[5])(src);
    RuntimeException::RuntimeException
              (this_03,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/SGXMLScanner.cpp"
               ,0xc66,Scan_CouldNotOpenSource,(XMLCh *)CONCAT44(extraout_var_00,iVar11),(XMLCh *)0x0
               ,(XMLCh *)0x0,(XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
  }
  __cxa_throw(this_03,&RuntimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

void SGXMLScanner::scanReset(const InputSource& src)
{

    //  This call implicitly tells us that we are going to reuse the scanner
    //  if it was previously used. So tell the validator to reset itself.
    //
    //  But, if the fUseCacheGrammar flag is set, then don't reset it.
    //
    //  NOTE:   The ReaderMgr is flushed on the way out, because that is
    //          required to insure that files are closed.
    fGrammarResolver->cacheGrammarFromParse(fToCacheGrammar);
    fGrammarResolver->useCachedGrammarInParse(fUseCachedGrammar);

    // Clear transient schema info list.
    //
    fSchemaInfoList->removeAll ();

    // fModel may need updating, as fGrammarResolver could have cleaned it
    if(fModel && getPSVIHandler())
        fModel = fGrammarResolver->getXSModel();

    // Create dummy schema grammar
    if (!fSchemaGrammar) {
        fSchemaGrammar = new (fGrammarPoolMemoryManager) SchemaGrammar(fGrammarPoolMemoryManager);
    }

    fGrammar = fSchemaGrammar;
    fGrammarType = Grammar::DTDGrammarType;
    fRootGrammar = 0;

    fValidator->setGrammar(fGrammar);
    if (fValidatorFromUser) {

        ((SchemaValidator*) fValidator)->setErrorReporter(fErrorReporter);
        ((SchemaValidator*) fValidator)->setGrammarResolver(fGrammarResolver);
        ((SchemaValidator*) fValidator)->setExitOnFirstFatal(fExitOnFirstFatal);
    }

    // Reset validation
    fValidate = (fValScheme == Val_Always) ? true : false;

    //  And for all installed handlers, send reset events. This gives them
    //  a chance to flush any cached data.
    if (fDocHandler)
        fDocHandler->resetDocument();
    if (fEntityHandler)
        fEntityHandler->resetEntities();
    if (fErrorReporter)
        fErrorReporter->resetErrors();

    // Clear out the id reference list
    resetValidationContext();

    // Reset the Root Element Name
    fMemoryManager->deallocate(fRootElemName);//delete [] fRootElemName;
    fRootElemName = 0;

    // Reset IdentityConstraints
    if (fICHandler)
        fICHandler->reset();

    //  Reset the element stack, and give it the latest ids for the special
    //  URIs it has to know about.
    fElemStack.reset
    (
        fEmptyNamespaceId
        , fUnknownNamespaceId
        , fXMLNamespaceId
        , fXMLNSNamespaceId
    );

    if (!fSchemaNamespaceId)
        fSchemaNamespaceId  = fURIStringPool->addOrFind(SchemaSymbols::fgURI_XSI);

    // Reset some status flags
    fInException = false;
    fStandalone = false;
    fErrorCount = 0;
    fHasNoDTD = true;
    fSeeXsi = false;
    fDoNamespaces = true;
    fDoSchema = true;

    // Reset PSVI context
    // Note that we always need this around for DOMTypeInfo
    if (!fPSVIElement)
        fPSVIElement = new (fMemoryManager) PSVIElement(fMemoryManager);

    if (!fErrorStack)
    {
        fErrorStack = new (fMemoryManager) ValueStackOf<bool>(8, fMemoryManager);
    }
    else
    {
        fErrorStack->removeAllElements();
    }

    resetPSVIElemContext();

    // Reset the validators
    fSchemaValidator->reset();
    fSchemaValidator->setErrorReporter(fErrorReporter);
    fSchemaValidator->setExitOnFirstFatal(fExitOnFirstFatal);
    fSchemaValidator->setGrammarResolver(fGrammarResolver);
    if (fValidatorFromUser)
        fValidator->reset();

    //  Handle the creation of the XML reader object for this input source.
    //  This will provide us with transcoding and basic lexing services.
    XMLReader* newReader = fReaderMgr.createReader
    (
        src
        , true
        , XMLReader::RefFrom_NonLiteral
        , XMLReader::Type_General
        , XMLReader::Source_External
        , fCalculateSrcOfs
        , fLowWaterMark
    );

    if (!newReader) {
        if (src.getIssueFatalErrorIfNotFound())
            ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Scan_CouldNotOpenSource, src.getSystemId(), fMemoryManager);
        else
            ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Scan_CouldNotOpenSource_Warning, src.getSystemId(), fMemoryManager);
    }

    // Push this read onto the reader manager
    fReaderMgr.pushReader(newReader, 0);

    // and reset security-related things if necessary:
    if(fSecurityManager != 0)
    {
        fEntityExpansionLimit = fSecurityManager->getEntityExpansionLimit();
        fEntityExpansionCount = 0;
    }
    fElemCount = 0;
    if(fUIntPoolRowTotal >= 32)
    { // 8 KB tied up with validating attributes...
        fAttDefRegistry->removeAll();
        recreateUIntPool();
    }
    else
    {
        // note that this will implicitly reset the values of the hashtables,
        // though their buckets will still be tied up
        resetUIntPool();
    }
    fUndeclaredAttrRegistry->removeAll();
}